

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

void If_CutPrintTiming(If_Man_t *p,If_Cut_t *pCut)

{
  If_Obj_t *pIVar1;
  ulong uVar2;
  
  Abc_Print(1,"{");
  for (uVar2 = 0; uVar2 < (byte)pCut->field_0x1f; uVar2 = uVar2 + 1) {
    pIVar1 = If_ManObj(p,(int)(&pCut[1].Area)[uVar2]);
    if (pIVar1 == (If_Obj_t *)0x0) break;
    Abc_Print(1," %d(%.2f/%.2f)",(double)(pIVar1->CutBest).Delay,(double)pIVar1->Required,
              (ulong)(uint)pIVar1->Id);
  }
  Abc_Print(1," }\n");
  return;
}

Assistant:

void If_CutPrintTiming( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    unsigned i;
    Abc_Print( 1, "{" );
    If_CutForEachLeaf( p, pCut, pLeaf, i )
        Abc_Print( 1, " %d(%.2f/%.2f)", pLeaf->Id, If_ObjCutBest(pLeaf)->Delay, pLeaf->Required );
    Abc_Print( 1, " }\n" );
}